

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode __thiscall
PDFWriter::ModifyPDF
          (PDFWriter *this,string *inModifiedFile,EPDFVersion inPDFVersion,
          string *inOptionalAlternativeOutputFile,LogConfiguration *inLogConfiguration,
          PDFCreationSettings *inPDFCreationSettings)

{
  __type _Var1;
  EStatusCode EVar2;
  long lVar3;
  IByteWriter *inOutputStream;
  IByteReader *inInputStream;
  IByteWriterWithPosition *pIVar4;
  OutputStreamTraits local_88;
  OutputStreamTraits traits;
  undefined1 local_70 [8];
  InputFile modifiedFileInput;
  EStatusCode status;
  PDFCreationSettings *inPDFCreationSettings_local;
  LogConfiguration *inLogConfiguration_local;
  string *inOptionalAlternativeOutputFile_local;
  EPDFVersion inPDFVersion_local;
  string *inModifiedFile_local;
  PDFWriter *this_local;
  
  modifiedFileInput.mFileStream._4_4_ = 0;
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  lVar3 = std::__cxx11::string::size();
  if ((lVar3 == 0) ||
     (_Var1 = std::operator==(inOptionalAlternativeOutputFile,inModifiedFile), _Var1)) {
    modifiedFileInput.mFileStream._4_4_ =
         OutputFile::OpenFile(&this->mOutputFile,inModifiedFile,true);
    if (modifiedFileInput.mFileStream._4_4_ != eSuccess) {
      return modifiedFileInput.mFileStream._4_4_;
    }
    pIVar4 = OutputFile::GetOutputStream(&this->mOutputFile);
    ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar4);
  }
  else {
    modifiedFileInput.mFileStream._4_4_ =
         OutputFile::OpenFile(&this->mOutputFile,inOptionalAlternativeOutputFile,false);
    if (modifiedFileInput.mFileStream._4_4_ != eSuccess) {
      return modifiedFileInput.mFileStream._4_4_;
    }
    InputFile::InputFile((InputFile *)local_70);
    modifiedFileInput.mFileStream._4_4_ = InputFile::OpenFile((InputFile *)local_70,inModifiedFile);
    if (modifiedFileInput.mFileStream._4_4_ == eSuccess) {
      inOutputStream = &OutputFile::GetOutputStream(&this->mOutputFile)->super_IByteWriter;
      OutputStreamTraits::OutputStreamTraits(&local_88,inOutputStream);
      inInputStream = &InputFile::GetInputStream((InputFile *)local_70)->super_IByteReader;
      modifiedFileInput.mFileStream._4_4_ =
           OutputStreamTraits::CopyToOutputStream(&local_88,inInputStream);
      if (modifiedFileInput.mFileStream._4_4_ == eSuccess) {
        pIVar4 = OutputFile::GetOutputStream(&this->mOutputFile);
        ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar4);
        ObjectsContext::WriteTokenSeparator(&this->mObjectsContext,eTokenSeparatorEndLine);
        traits.mOutputStream._0_4_ = 0;
      }
      else {
        traits.mOutputStream._0_4_ = 2;
      }
      OutputStreamTraits::~OutputStreamTraits(&local_88);
    }
    else {
      traits.mOutputStream._0_4_ = 2;
    }
    InputFile::~InputFile((InputFile *)local_70);
    if ((int)traits.mOutputStream != 0) {
      return modifiedFileInput.mFileStream._4_4_;
    }
  }
  PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,&this->mOutputFile);
  this->mIsModified = true;
  EVar2 = SetupStateFromModifiedFile(this,inModifiedFile,inPDFVersion,inPDFCreationSettings);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::ModifyPDF(const std::string& inModifiedFile,
                                            EPDFVersion inPDFVersion,
                                            const std::string& inOptionalAlternativeOutputFile,
                                            const LogConfiguration& inLogConfiguration,
                                            const PDFCreationSettings& inPDFCreationSettings)
{
    EStatusCode status = eSuccess;

    SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);

    do
    {
        // either append to original file, or create a new copy and "modify" it. depending on users choice
        if(inOptionalAlternativeOutputFile.size() == 0 || (inOptionalAlternativeOutputFile == inModifiedFile))
        {
            status = mOutputFile.OpenFile(inModifiedFile,true);
            if(status != eSuccess)
                break;
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
		}
        else
        {
            status = mOutputFile.OpenFile(inOptionalAlternativeOutputFile);
            if(status != eSuccess)
               break;

            // copy original to new output file
            InputFile modifiedFileInput;
            status = modifiedFileInput.OpenFile(inModifiedFile);
            if(status != eSuccess)
                break;

            OutputStreamTraits traits(mOutputFile.GetOutputStream());
            status = traits.CopyToOutputStream(modifiedFileInput.GetInputStream());
            if(status != eSuccess)
                break;

			// add an extra newline after eof, just in case the original file didn't have it
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
			mObjectsContext.WriteTokenSeparator(eTokenSeparatorEndLine);
        }

        mDocumentContext.SetOutputFileInformation(&mOutputFile);

        // do setup for modification
        mIsModified = true;
        status = SetupStateFromModifiedFile(inModifiedFile, inPDFVersion, inPDFCreationSettings);
    }
    while (false);

    return status;
}